

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::lerp
          (LightNodeImpl<embree::SceneGraph::QuadLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  _func_int **pp_Var1;
  LightNodeImpl<embree::SceneGraph::QuadLight> *this_00;
  long *in_RDX;
  long in_RSI;
  LightNode *in_RDI;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>_> light1;
  QuadLight *in_stack_fffffffffffffec8;
  long *local_110;
  long lVar2;
  float f_00;
  QuadLight *in_stack_ffffffffffffff18;
  QuadLight *in_stack_ffffffffffffff20;
  long *local_70 [5];
  _func_int **local_48;
  long **local_30;
  long **local_28;
  long **local_20;
  long *local_10;
  long **local_8;
  
  local_30 = local_70;
  lVar2 = *in_RDX;
  if (lVar2 == 0) {
    local_110 = (long *)0x0;
  }
  else {
    local_110 = (long *)__dynamic_cast(lVar2,&LightNode::typeinfo,&typeinfo,0);
  }
  f_00 = (float)((ulong)lVar2 >> 0x20);
  local_8 = local_70;
  local_10 = local_110;
  local_70[0] = local_110;
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 0x10))();
  }
  pp_Var1 = (_func_int **)operator_new(0x3d7e77);
  this_00 = (LightNodeImpl<embree::SceneGraph::QuadLight> *)(in_RSI + 0x70);
  local_28 = local_70;
  QuadLight::lerp(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,f_00);
  LightNodeImpl(this_00,in_stack_fffffffffffffec8);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var1;
  local_48 = pp_Var1;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  local_20 = local_70;
  if (local_70[0] != (long *)0x0) {
    (**(code **)(*local_70[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)in_RDI;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }